

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int wally_psbt_extract(wally_psbt *psbt,wally_tx **output)

{
  wally_tx *pwVar1;
  _Bool _Var2;
  long lVar3;
  wally_tx_input *tx_input;
  wally_psbt_input *input;
  wally_tx *pwStack_30;
  int ret;
  size_t i;
  wally_tx *result;
  wally_tx **output_local;
  wally_psbt *psbt_local;
  
  i = 0;
  if (output == (wally_tx **)0x0) {
    psbt_local._4_4_ = -2;
  }
  else {
    *output = (wally_tx *)0x0;
    if (((((psbt == (wally_psbt *)0x0) || (psbt->tx == (wally_tx *)0x0)) || (psbt->num_inputs == 0))
        || ((psbt->num_outputs == 0 || (psbt->tx->num_inputs != psbt->num_inputs)))) ||
       (psbt->tx->num_outputs != psbt->num_outputs)) {
      psbt_local._4_4_ = -2;
    }
    else {
      result = (wally_tx *)output;
      output_local = (wally_tx **)psbt;
      input._4_4_ = tx_clone_alloc(psbt->tx,(wally_tx **)&i);
      psbt_local._4_4_ = input._4_4_;
      if (input._4_4_ == 0) {
        for (pwStack_30 = (wally_tx *)0x0; pwStack_30 < output_local[3];
            pwStack_30 = (wally_tx *)((long)&pwStack_30->version + 1)) {
          pwVar1 = output_local[2];
          lVar3 = *(long *)(i + 8) + (long)pwStack_30 * 0xd0;
          if ((*(long *)((long)pwVar1 + (long)pwStack_30 * 0x110 + 0x30) == 0) &&
             (*(long *)((long)pwVar1 + (long)pwStack_30 * 0x110 + 0x40) == 0)) {
            input._4_4_ = -2;
            break;
          }
          if (*(long *)((long)pwVar1 + (long)pwStack_30 * 0x110 + 0x30) != 0) {
            if (*(long *)(lVar3 + 0x28) != 0) {
              input._4_4_ = -2;
              break;
            }
            _Var2 = clone_bytes((uchar **)(lVar3 + 0x28),
                                *(uchar **)((long)pwVar1 + (long)pwStack_30 * 0x110 + 0x30),
                                *(size_t *)((long)pwVar1 + (long)pwStack_30 * 0x110 + 0x38));
            if (!_Var2) {
              input._4_4_ = -3;
              break;
            }
            *(undefined8 *)(lVar3 + 0x30) =
                 *(undefined8 *)((long)pwVar1 + (long)pwStack_30 * 0x110 + 0x38);
          }
          if (*(long *)((long)pwVar1 + (long)pwStack_30 * 0x110 + 0x40) != 0) {
            if (*(long *)(lVar3 + 0x38) != 0) {
              input._4_4_ = -2;
              break;
            }
            input._4_4_ = wally_tx_witness_stack_clone_alloc
                                    (*(wally_tx_witness_stack **)
                                      ((long)pwVar1 + (long)pwStack_30 * 0x110 + 0x40),
                                     (wally_tx_witness_stack **)(lVar3 + 0x38));
            if (input._4_4_ != 0) break;
          }
        }
        if (input._4_4_ == 0) {
          result->version = (undefined4)i;
          result->locktime = i._4_4_;
        }
        else {
          wally_tx_free((wally_tx *)i);
        }
        psbt_local._4_4_ = input._4_4_;
      }
    }
  }
  return psbt_local._4_4_;
}

Assistant:

int wally_psbt_extract(const struct wally_psbt *psbt, struct wally_tx **output)
{
    struct wally_tx *result = NULL;
    size_t i;
    int ret;

    TX_CHECK_OUTPUT;

    if (!psbt || !psbt->tx || !psbt->num_inputs || !psbt->num_outputs ||
        psbt->tx->num_inputs != psbt->num_inputs ||
        psbt->tx->num_outputs != psbt->num_outputs)
        return WALLY_EINVAL;

    if ((ret = tx_clone_alloc(psbt->tx, &result)) != WALLY_OK)
        return ret;

    for (i = 0; i < psbt->num_inputs; ++i) {
        const struct wally_psbt_input *input = &psbt->inputs[i];
        struct wally_tx_input *tx_input = &result->inputs[i];

        if (!input->final_scriptsig && !input->final_witness) {
            ret = WALLY_EINVAL;
            break;
        }

        if (input->final_scriptsig) {
            if (tx_input->script) {
                /* Our global tx shouldn't have a scriptSig */
                ret = WALLY_EINVAL;
                break;
            }
            if (!clone_bytes(&tx_input->script,
                             input->final_scriptsig,
                             input->final_scriptsig_len)) {
                ret = WALLY_ENOMEM;
                break;
            }
            tx_input->script_len = input->final_scriptsig_len;
        }
        if (input->final_witness) {
            if (tx_input->witness) {
                /* Our global tx shouldn't have a witness */
                ret = WALLY_EINVAL;
                break;
            }
            ret = wally_tx_witness_stack_clone_alloc(input->final_witness,
                                                     &tx_input->witness);
            if (ret != WALLY_OK)
                break;
        }
    }

    if (ret == WALLY_OK)
        *output = result;
    else
        wally_tx_free(result);
    return ret;
}